

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osscurses.cc
# Opt level: O3

int oss_eof_on_stdin(void)

{
  int iVar1;
  fd_set rfds;
  timeval local_98;
  fd_set local_80;
  
  local_98.tv_sec = 0;
  local_98.tv_usec = 0;
  local_80.fds_bits[1] = 0;
  local_80.fds_bits[2] = 0;
  local_80.fds_bits[3] = 0;
  local_80.fds_bits[4] = 0;
  local_80.fds_bits[5] = 0;
  local_80.fds_bits[6] = 0;
  local_80.fds_bits[7] = 0;
  local_80.fds_bits[8] = 0;
  local_80.fds_bits[9] = 0;
  local_80.fds_bits[10] = 0;
  local_80.fds_bits[0xb] = 0;
  local_80.fds_bits[0xc] = 0;
  local_80.fds_bits[0xd] = 0;
  local_80.fds_bits[0xe] = 0;
  local_80.fds_bits[0xf] = 0;
  local_80.fds_bits[0] = 1;
  iVar1 = select(1,&local_80,(fd_set *)0x0,(fd_set *)0x0,&local_98);
  return (int)(iVar1 == -1);
}

Assistant:

int
oss_eof_on_stdin()
{
#ifndef MSDOS
    fd_set rfds;
    timeval tv;

    // Zero time: non-blocking operation.
    tv.tv_sec = 0;
    tv.tv_usec = 0;

    FD_ZERO(&rfds);
    // stdin always has a file descriptor of 0.
    FD_SET(0, &rfds);

    return select(1, &rfds, 0, 0, &tv) == -1;
#else
    return _eof(_fileno(stdin)) > 0;
#endif
}